

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_compress.c
# Opt level: O3

int load_images(dircnt_t *dirptr,char *imgdirpath)

{
  DIR *pDVar1;
  
  pDVar1 = opendir(imgdirpath);
  if (pDVar1 != (DIR *)0x0) {
    load_images_cold_1();
  }
  else {
    fprintf(_stderr,"Could not open Folder %s\n",imgdirpath);
  }
  return (uint)(pDVar1 == (DIR *)0x0);
}

Assistant:

static int load_images(dircnt_t *dirptr, char *imgdirpath)
{
    DIR *dir;
    struct dirent* content;
    int i = 0;

    /*Reading the input images from given input directory*/

    dir = opendir(imgdirpath);
    if (!dir) {
        fprintf(stderr, "Could not open Folder %s\n", imgdirpath);
        return 1;
    } else   {
        fprintf(stderr, "Folder opened successfully\n");
    }

    while ((content = readdir(dir)) != NULL) {
        if (strcmp(".", content->d_name) == 0 || strcmp("..", content->d_name) == 0) {
            continue;
        }

        strcpy(dirptr->filename[i], content->d_name);
        i++;
    }
    closedir(dir);
    return 0;
}